

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O3

void pulse_defer_event_cb(pa_mainloop_api *a,void *userdata)

{
  size_t nbytes;
  cubeb_stream_conflict *stm;
  
  if (*(int *)((long)userdata + 0x50) != 0) {
    return;
  }
  nbytes = (*cubeb_pa_stream_writable_size)(*(pa_stream **)((long)userdata + 0x10));
  trigger_user_callback
            (*(pa_stream **)((long)userdata + 0x10),(void *)0x0,nbytes,
             (cubeb_stream_conflict *)userdata);
  return;
}

Assistant:

static void
pulse_defer_event_cb(pa_mainloop_api * a, void * userdata)
{
  (void)a;
  cubeb_stream * stm = userdata;
  if (stm->shutdown) {
    return;
  }
  size_t writable_size = WRAP(pa_stream_writable_size)(stm->output_stream);
  trigger_user_callback(stm->output_stream, NULL, writable_size, stm);
}